

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O2

void __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::initialize
          (InputParameter<3UL,_ruckig::StandardVector> *this)

{
  ulong uVar1;
  size_t dof;
  ulong uVar2;
  
  uVar1 = this->degrees_of_freedom;
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    (this->current_velocity)._M_elems[uVar2] = 0.0;
    (this->current_acceleration)._M_elems[uVar2] = 0.0;
    (this->target_velocity)._M_elems[uVar2] = 0.0;
    (this->target_acceleration)._M_elems[uVar2] = 0.0;
    (this->max_acceleration)._M_elems[uVar2] = INFINITY;
    (this->max_jerk)._M_elems[uVar2] = INFINITY;
    (this->enabled)._M_elems[uVar2] = true;
  }
  return;
}

Assistant:

void initialize() {
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            current_velocity[dof] = 0.0;
            current_acceleration[dof] = 0.0;
            target_velocity[dof] = 0.0;
            target_acceleration[dof] = 0.0;
            max_acceleration[dof] = std::numeric_limits<double>::infinity();
            max_jerk[dof] = std::numeric_limits<double>::infinity();
            enabled[dof] = true;
        }
    }